

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_setgid_fails(void)

{
  __uid_t _Var1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  anon_union_8_2_13e1ed65_for_data aVar4;
  uv_loop_t *puVar5;
  int *piVar6;
  ulong uVar7;
  uv_process_options_t *loop;
  ulong uVar8;
  uv_buf_t *buf;
  uv_process_options_t *unaff_RBX;
  undefined1 *nread;
  uv_stream_t *stream;
  uv_process_options_t *unaff_R14;
  uv_signal_s *__nmemb;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_8f0 [24];
  uv_buf_t uStack_8d8;
  uv_fs_t uStack_8c0;
  uv_pipe_t uStack_700;
  uv_stdio_container_t uStack_618;
  undefined4 uStack_608;
  undefined4 uStack_5f8;
  anon_union_8_2_13e1ed65_for_data aStack_5e0;
  long lStack_5a8;
  uint uStack_5a0;
  int iStack_59c;
  uv_buf_t uStack_598;
  char acStack_588 [16];
  uv_stdio_container_t uStack_578;
  uv_write_t uStack_568;
  uv_write_t uStack_4a0;
  uv_stream_t uStack_3d8;
  uv_fs_t uStack_2f0;
  anon_union_8_2_13e1ed65_for_data aStack_130;
  uv_signal_s *puStack_128;
  uv_signal_s *puStack_120;
  uv_signal_s *puStack_118;
  anon_union_8_2_13e1ed65_for_data aStack_110;
  char cStack_f9;
  uv__queue *puStack_f8;
  uv__queue *puStack_f0;
  anon_union_8_2_13e1ed65_for_data aStack_e8;
  uv_signal_s *puStack_e0;
  uv_signal_s *apuStack_d8 [2];
  uv_signal_s *puStack_c8;
  cpu_set_t cStack_c0;
  anon_union_8_2_13e1ed65_for_data aStack_38;
  
  _Var1 = getuid();
  if (_Var1 == 0) {
    aVar4.stream = (uv_stream_t *)getpwnam("nobody");
    if ((uv_loop_t *)aVar4.stream == (uv_loop_t *)0x0) goto LAB_001bedad;
    iVar2 = setgid(*(__gid_t *)&(aVar4.stream)->field_0x14);
    unaff_RBX = (uv_process_options_t *)aVar4.stream;
    if (iVar2 != 0) goto LAB_001bedb2;
    iVar2 = setuid(*(uv_handle_type *)&((uv__queue *)&(aVar4.stream)->type)->next);
    if (iVar2 == 0) goto LAB_001bec76;
  }
  else {
LAB_001bec76:
    init_process_options("spawn_helper1",fail_cb);
    unaff_RBX = &options;
    options.flags._0_1_ = (byte)options.flags | 2;
    options.gid = 0;
    puVar5 = uv_default_loop();
    iVar2 = uv_spawn(puVar5,&process,&options);
    if (iVar2 == -1) {
      puVar5 = uv_default_loop();
      iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
      if (iVar2 != 0) goto LAB_001bed86;
      if (close_cb_called != 0) goto LAB_001bed93;
      unaff_RBX = (uv_process_options_t *)uv_default_loop();
      uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
      uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar2 = uv_loop_close(puVar5);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      run_test_spawn_setgid_fails_cold_3();
LAB_001bed86:
      run_test_spawn_setgid_fails_cold_4();
LAB_001bed93:
      run_test_spawn_setgid_fails_cold_5();
    }
    run_test_spawn_setgid_fails_cold_6();
LAB_001bedad:
    run_test_spawn_setgid_fails_cold_7();
LAB_001bedb2:
    run_test_spawn_setgid_fails_cold_1();
  }
  run_test_spawn_setgid_fails_cold_2();
  aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1beddf;
  aStack_38 = (anon_union_8_2_13e1ed65_for_data)unaff_RBX;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1befd4;
    run_test_spawn_affinity_cold_1();
LAB_001befd4:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1befe1;
    run_test_spawn_affinity_cold_2();
LAB_001befe1:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1befee;
    run_test_spawn_affinity_cold_3();
LAB_001befee:
    loop = unaff_RBX;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1beff3;
    run_test_spawn_affinity_cold_9();
LAB_001beff3:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1beff8;
    run_test_spawn_affinity_cold_4();
LAB_001beff8:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1beffd;
    run_test_spawn_affinity_cold_5();
LAB_001beffd:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bf002;
    run_test_spawn_affinity_cold_6();
LAB_001bf002:
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bf007;
    run_test_spawn_affinity_cold_7();
  }
  else {
    unaff_RBX._4_4_ = 0;
    unaff_RBX._0_4_ = uVar3;
    cStack_c0.__bits[0xe] = 0;
    cStack_c0.__bits[0xf] = 0;
    cStack_c0.__bits[0xc] = 0;
    cStack_c0.__bits[0xd] = 0;
    cStack_c0.__bits[10] = 0;
    cStack_c0.__bits[0xb] = 0;
    cStack_c0.__bits[8] = 0;
    cStack_c0.__bits[9] = 0;
    cStack_c0.__bits[6] = 0;
    cStack_c0.__bits[7] = 0;
    cStack_c0.__bits[4] = 0;
    cStack_c0.__bits[5] = 0;
    cStack_c0.__bits[2] = 0;
    cStack_c0.__bits[3] = 0;
    cStack_c0.__bits[0] = 0;
    cStack_c0.__bits[1] = 0;
    unaff_R14 = (uv_process_options_t *)0x0;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bee1f;
    iVar2 = sched_getaffinity(0,0x80,&cStack_c0);
    if (iVar2 != 0) {
      aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bee28;
      piVar6 = __errno_location();
      unaff_R14 = (uv_process_options_t *)(long)*piVar6;
    }
    puStack_e0 = (uv_signal_s *)0x0;
    apuStack_d8[0] = (uv_signal_s *)unaff_R14;
    if ((uv_signal_s *)unaff_R14 != (uv_signal_s *)0x0) goto LAB_001befd4;
    uVar8 = 1;
    if (1 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    uVar7 = 0;
    do {
      if ((uVar7 < 0x400) && ((cStack_c0.__bits[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0))
      goto LAB_001bee78;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    uVar7 = (ulong)uVar3;
LAB_001bee78:
    unaff_R14 = (uv_process_options_t *)(uVar7 & 0xffffffff);
    __nmemb = (uv_signal_s *)(ulong)uVar3;
    puStack_e0 = __nmemb;
    apuStack_d8[0] = (uv_signal_s *)unaff_R14;
    if (__nmemb <= unaff_R14) goto LAB_001befe1;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1beeb4;
    snprintf((char *)apuStack_d8,0xb,"%d",unaff_R14);
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1beec7;
    init_process_options("spawn_helper_affinity",exit_cb);
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1beed4;
    loop = (uv_process_options_t *)calloc((size_t)__nmemb,1);
    if ((uv_loop_t *)loop == (uv_loop_t *)0x0) goto LAB_001befee;
    *(undefined1 *)((long)&((uv_signal_s *)unaff_R14)->data + (long)&((uv_stream_t *)loop)->data) =
         1;
    unaff_R14 = &options;
    options.cpumask = (char *)loop;
    options.cpumask_size = (size_t)__nmemb;
    options.args[2] = (char *)apuStack_d8;
    options.args[3] = "dummy";
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bef1c;
    puVar5 = uv_default_loop();
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bef2e;
    iVar2 = uv_spawn(puVar5,&process,&options);
    if (iVar2 != 0) goto LAB_001beff3;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bef3b;
    puVar5 = uv_default_loop();
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bef45;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_001beff8;
    if (exit_cb_called != 1) goto LAB_001beffd;
    if (close_cb_called != 1) goto LAB_001bf002;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bef6f;
    free(loop);
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bef74;
    loop = (uv_process_options_t *)uv_default_loop();
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bef88;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bef92;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_e0 = (uv_signal_s *)0x0;
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1bef9f;
    puVar5 = uv_default_loop();
    aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1befa7;
    iVar2 = uv_loop_close(puVar5);
    puStack_c8 = (uv_signal_s *)(long)iVar2;
    if (puStack_e0 == puStack_c8) {
      aStack_e8 = (anon_union_8_2_13e1ed65_for_data)0x1befbe;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_e8.stream = (uv_stream_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf01e;
  aStack_e8 = (anon_union_8_2_13e1ed65_for_data)loop;
  iVar2 = uv_cpumask_size();
  if (iVar2 < 1) {
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf0dd;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001bf0dd:
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf0e2;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001bf0e2:
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf0e7;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf039;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_f9;
    cStack_f9 = '\0';
    options.cpumask_size = 0;
    loop = &options;
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf05f;
    puVar5 = uv_default_loop();
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf071;
    iVar2 = uv_spawn(puVar5,&process,&options);
    if (iVar2 != -0x16) goto LAB_001bf0dd;
    if (exit_cb_called != 0) goto LAB_001bf0e2;
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf084;
    loop = (uv_process_options_t *)uv_default_loop();
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf098;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf0a2;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_f0 = (uv__queue *)0x0;
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf0b0;
    puVar5 = uv_default_loop();
    aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf0b8;
    iVar2 = uv_loop_close(puVar5);
    puStack_f8 = (uv__queue *)(long)iVar2;
    if (puStack_f0 == puStack_f8) {
      aStack_110 = (anon_union_8_2_13e1ed65_for_data)0x1bf0d0;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_110.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_128 = (uv_signal_s *)0x1bf109;
  aStack_110 = (anon_union_8_2_13e1ed65_for_data)loop;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_128 = (uv_signal_s *)0x1bf10e;
  puVar5 = uv_default_loop();
  puStack_128 = (uv_signal_s *)0x1bf124;
  iVar2 = uv_spawn(puVar5,&process,&options);
  puStack_118 = (uv_signal_s *)(long)iVar2;
  puStack_120 = (uv_signal_s *)0x0;
  if (puStack_118 == (uv_signal_s *)0x0) {
    puStack_128 = (uv_signal_s *)0x1bf147;
    puVar5 = uv_default_loop();
    puStack_128 = (uv_signal_s *)0x1bf151;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_118 = (uv_signal_s *)(long)iVar2;
    puStack_120 = (uv_signal_s *)0x0;
    if (puStack_118 != (uv_signal_s *)0x0) goto LAB_001bf262;
    puStack_128 = (uv_signal_s *)0x1bf17b;
    iVar2 = uv_is_closing((uv_handle_t *)&process);
    puStack_118 = (uv_signal_s *)(long)iVar2;
    puStack_120 = (uv_signal_s *)0x0;
    if (puStack_118 != (uv_signal_s *)0x0) goto LAB_001bf26f;
    puStack_128 = (uv_signal_s *)0x1bf1a7;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puStack_128 = (uv_signal_s *)0x1bf1ac;
    puVar5 = uv_default_loop();
    puStack_128 = (uv_signal_s *)0x1bf1b6;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_118 = (uv_signal_s *)(long)iVar2;
    puStack_120 = (uv_signal_s *)0x0;
    if (puStack_118 != (uv_signal_s *)0x0) goto LAB_001bf27c;
    puStack_118 = (uv_signal_s *)0x1;
    puStack_128 = (uv_signal_s *)0x1bf1e9;
    iVar2 = uv_is_closing((uv_handle_t *)&process);
    puStack_120 = (uv_signal_s *)(long)iVar2;
    if (puStack_118 != puStack_120) goto LAB_001bf289;
    puStack_128 = (uv_signal_s *)0x1bf203;
    loop = (uv_process_options_t *)uv_default_loop();
    puStack_128 = (uv_signal_s *)0x1bf217;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_128 = (uv_signal_s *)0x1bf221;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_118 = (uv_signal_s *)0x0;
    puStack_128 = (uv_signal_s *)0x1bf22f;
    puVar5 = uv_default_loop();
    puStack_128 = (uv_signal_s *)0x1bf237;
    iVar2 = uv_loop_close(puVar5);
    puStack_120 = (uv_signal_s *)(long)iVar2;
    if (puStack_118 == puStack_120) {
      puStack_128 = (uv_signal_s *)0x1bf24d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_128 = (uv_signal_s *)0x1bf262;
    run_test_spawn_auto_unref_cold_1();
LAB_001bf262:
    puStack_128 = (uv_signal_s *)0x1bf26f;
    run_test_spawn_auto_unref_cold_2();
LAB_001bf26f:
    puStack_128 = (uv_signal_s *)0x1bf27c;
    run_test_spawn_auto_unref_cold_3();
LAB_001bf27c:
    puStack_128 = (uv_signal_s *)0x1bf289;
    run_test_spawn_auto_unref_cold_4();
LAB_001bf289:
    puStack_128 = (uv_signal_s *)0x1bf296;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_128 = (uv_signal_s *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  builtin_strncpy(acStack_588,"/dev/null",10);
  aStack_130 = (anon_union_8_2_13e1ed65_for_data)loop;
  puStack_128 = (uv_signal_s *)unaff_R14;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&uStack_2f0,acStack_588,2,0,(uv_fs_cb)0x0);
  uStack_3d8.data = (void *)(long)iVar2;
  uStack_4a0.data = (void *)0x0;
  if (uStack_3d8.data == (void *)0x0) {
    uStack_5a0 = (undefined4)uStack_2f0.result;
    init_process_options("spawn_helper8",exit_cb);
    puVar5 = uv_default_loop();
    loop = (uv_process_options_t *)&uStack_3d8;
    iVar2 = uv_pipe_init(puVar5,(uv_pipe_t *)loop,0);
    uStack_4a0.data = (void *)(long)iVar2;
    uStack_568.data = (void *)0x0;
    if (uStack_4a0.data != (void *)0x0) goto LAB_001bf5ba;
    options.stdio = &uStack_578;
    uStack_578.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_578.data.stream = (uv_stream_t *)loop;
    iStack_59c = dup(uStack_5a0);
    puVar5 = uv_default_loop();
    iVar2 = uv_spawn(puVar5,&process,&options);
    uStack_4a0.data = (void *)(long)iVar2;
    uStack_568.data = (void *)0x0;
    if (uStack_4a0.data != (void *)0x0) goto LAB_001bf5cc;
    uStack_598 = uv_buf_init((char *)&uStack_5a0,4);
    iVar2 = uv_write(&uStack_4a0,&uStack_3d8,&uStack_598,1,write_null_cb);
    uStack_568.data = (void *)(long)iVar2;
    if (uStack_568.data != (void *)0x0) goto LAB_001bf5de;
    uStack_598 = uv_buf_init((char *)&iStack_59c,4);
    iVar2 = uv_write(&uStack_568,&uStack_3d8,&uStack_598,1,write_cb);
    lStack_5a8 = 0;
    if (iVar2 != 0) goto LAB_001bf5ed;
    puVar5 = uv_default_loop();
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStack_5a8 = 0;
    if (iVar2 != 0) goto LAB_001bf5fc;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&uStack_2f0,uStack_5a0,(uv_fs_cb)0x0);
    lStack_5a8 = 0;
    if (iVar2 != 0) goto LAB_001bf60b;
    lStack_5a8 = (long)exit_cb_called;
    if (lStack_5a8 != 1) goto LAB_001bf61a;
    lStack_5a8 = (long)close_cb_called;
    if (lStack_5a8 != 2) goto LAB_001bf629;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    lStack_5a8 = (long)iVar2;
    if (lStack_5a8 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001bf5ba:
    run_test_spawn_fs_open_cold_2();
LAB_001bf5cc:
    run_test_spawn_fs_open_cold_3();
LAB_001bf5de:
    run_test_spawn_fs_open_cold_4();
LAB_001bf5ed:
    run_test_spawn_fs_open_cold_5();
LAB_001bf5fc:
    run_test_spawn_fs_open_cold_6();
LAB_001bf60b:
    run_test_spawn_fs_open_cold_7();
LAB_001bf61a:
    run_test_spawn_fs_open_cold_8();
LAB_001bf629:
    run_test_spawn_fs_open_cold_9();
  }
  iVar2 = (int)&lStack_5a8;
  run_test_spawn_fs_open_cold_10();
  if (iVar2 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  aStack_5e0 = (anon_union_8_2_13e1ed65_for_data)loop;
  uStack_8d8 = uv_buf_init("",1);
  iVar2 = uv_pipe((uv_os_fd_t *)(auStack_8f0 + 0x10),0,0);
  if (iVar2 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_618;
    uStack_618.flags = UV_INHERIT_FD;
    uStack_618.data.file = auStack_8f0._16_4_;
    uStack_608 = 0;
    uStack_5f8 = 0;
    puVar5 = uv_default_loop();
    iVar2 = uv_spawn(puVar5,&process,&options);
    uStack_8c0.data = (void *)(long)iVar2;
    uStack_700.data = (void *)0x0;
    if ((uv_handle_t *)uStack_8c0.data != (uv_handle_t *)0x0) goto LAB_001bfaf5;
    uv_unref((uv_handle_t *)&process);
    puVar5 = uv_default_loop();
    iVar2 = uv_pipe_init(puVar5,&uStack_700,0);
    uStack_8c0.data = (void *)(long)iVar2;
    auStack_8f0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_8c0.data != (uv_handle_t *)0x0) goto LAB_001bfb07;
    iVar2 = uv_pipe_open(&uStack_700,auStack_8f0._16_4_);
    uStack_8c0.data = (void *)(long)iVar2;
    auStack_8f0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_8c0.data != (uv_handle_t *)0x0) goto LAB_001bfb16;
    auStack_8f0._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar2 = uv_read_start((uv_stream_t *)&uStack_700,on_alloc,on_read_once);
    uStack_8c0.data = (void *)(long)iVar2;
    auStack_8f0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_8c0.data != (uv_handle_t *)0x0) goto LAB_001bfb25;
    auStack_8f0._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&uStack_8c0,auStack_8f0._20_4_,&uStack_8d8,1,-1,
                        (uv_fs_cb)0x0);
    auStack_8f0._8_8_ = SEXT48(iVar2);
    if (auStack_8f0._0_8_ != auStack_8f0._8_8_) goto LAB_001bfb34;
    auStack_8f0._0_8_ = (uv_loop_t *)0x1;
    auStack_8f0._8_8_ = uStack_8c0.result;
    if ((uv_loop_t *)uStack_8c0.result != (uv_loop_t *)0x1) goto LAB_001bfb43;
    uv_fs_req_cleanup(&uStack_8c0);
    puVar5 = uv_default_loop();
    iVar2 = uv_run(puVar5,UV_RUN_ONCE);
    auStack_8f0._0_8_ = SEXT48(iVar2);
    auStack_8f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb52;
    auStack_8f0._0_8_ = (uv_loop_t *)0x1;
    auStack_8f0._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_8f0._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfb61;
    uv_close((uv_handle_t *)&uStack_700,close_cb);
    auStack_8f0._0_8_ = (uv_loop_t *)0x1;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&uStack_8c0,auStack_8f0._20_4_,&uStack_8d8,1,-1,
                        (uv_fs_cb)0x0);
    auStack_8f0._8_8_ = SEXT48(iVar2);
    if (auStack_8f0._0_8_ != auStack_8f0._8_8_) goto LAB_001bfb70;
    auStack_8f0._0_8_ = (uv_loop_t *)0x1;
    auStack_8f0._8_8_ = uStack_8c0.result;
    if ((uv_loop_t *)uStack_8c0.result != (uv_loop_t *)0x1) goto LAB_001bfb7f;
    uv_fs_req_cleanup(&uStack_8c0);
    puVar5 = uv_default_loop();
    iVar2 = uv_timer_init(puVar5,&timer);
    auStack_8f0._0_8_ = SEXT48(iVar2);
    auStack_8f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb8e;
    iVar2 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_8f0._0_8_ = SEXT48(iVar2);
    auStack_8f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb9d;
    puVar5 = uv_default_loop();
    iVar2 = uv_run(puVar5,UV_RUN_ONCE);
    if (iVar2 == 1) {
      puVar5 = uv_default_loop();
      iVar2 = uv_run(puVar5,UV_RUN_ONCE);
      auStack_8f0._0_8_ = SEXT48(iVar2);
      auStack_8f0._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_8f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbe8;
    }
    auStack_8f0._0_8_ = (uv_loop_t *)0x1;
    auStack_8f0._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_8f0._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfbac;
    iVar2 = uv_process_kill(&process,0xf);
    auStack_8f0._0_8_ = SEXT48(iVar2);
    auStack_8f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbbb;
    iVar2 = close(auStack_8f0._20_4_);
    auStack_8f0._0_8_ = SEXT48(iVar2);
    auStack_8f0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_8f0._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbca;
    auStack_8f0._20_4_ = -1;
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_8f0._0_8_ = (uv_loop_t *)0x0;
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    auStack_8f0._8_8_ = SEXT48(iVar2);
    if (auStack_8f0._0_8_ == auStack_8f0._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001bfaf5:
    run_test_closed_fd_events_cold_2();
LAB_001bfb07:
    run_test_closed_fd_events_cold_3();
LAB_001bfb16:
    run_test_closed_fd_events_cold_4();
LAB_001bfb25:
    run_test_closed_fd_events_cold_5();
LAB_001bfb34:
    run_test_closed_fd_events_cold_6();
LAB_001bfb43:
    run_test_closed_fd_events_cold_7();
LAB_001bfb52:
    run_test_closed_fd_events_cold_8();
LAB_001bfb61:
    run_test_closed_fd_events_cold_9();
LAB_001bfb70:
    run_test_closed_fd_events_cold_10();
LAB_001bfb7f:
    run_test_closed_fd_events_cold_11();
LAB_001bfb8e:
    run_test_closed_fd_events_cold_12();
LAB_001bfb9d:
    run_test_closed_fd_events_cold_13();
LAB_001bfbac:
    run_test_closed_fd_events_cold_15();
LAB_001bfbbb:
    run_test_closed_fd_events_cold_16();
LAB_001bfbca:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001bfbe8:
  stream = (uv_stream_t *)auStack_8f0;
  nread = auStack_8f0 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop(stream);
  on_read(stream,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_setgid_fails) {
  int r;

  /* if root, become nobody. */
  /* On IBMi PASE, there is no nobody user. */
#ifndef __PASE__
  uv_uid_t uid = getuid();
  if (uid == 0) {
    struct passwd* pw;
    pw = getpwnam("nobody");
    ASSERT_NOT_NULL(pw);
    ASSERT_OK(setgid(pw->pw_gid));
    ASSERT_OK(setuid(pw->pw_uid));
  }
#endif  /* !__PASE__ */

  init_process_options("spawn_helper1", fail_cb);

  options.flags |= UV_PROCESS_SETGID;
  /* On IBMi PASE, there is no root user. User may grant 
   * root-like privileges, including setting gid to 0.
   */
#if defined(__MVS__) || defined(__PASE__)
  options.gid = -1;
#else
  options.gid = 0;
#endif

  r = uv_spawn(uv_default_loop(), &process, &options);
#if defined(__CYGWIN__) || defined(__MVS__)
  ASSERT_EQ(r, UV_EINVAL);
#else
  ASSERT_EQ(r, UV_EPERM);
#endif

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}